

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int noentParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  long lVar2;
  char *r1;
  uint local_44;
  int res;
  char *temp;
  xmlDocPtr doc;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  lVar2 = xmlReadFile(filename,0,options);
  if (lVar2 == 0) {
    filename_local._4_4_ = 1;
  }
  else {
    r1 = resultFilename(filename,temp_directory,".res");
    if (r1 == (char *)0x0) {
      fprintf(_stderr,"Out of memory\n");
      fatalError();
    }
    xmlSaveFile(r1,lVar2);
    iVar1 = compareFiles(r1,result);
    local_44 = (uint)(iVar1 != 0);
    xmlFreeDoc(lVar2);
    lVar2 = xmlReadFile(filename,0,options);
    if (lVar2 == 0) {
      filename_local._4_4_ = 1;
    }
    else {
      xmlSaveFile(r1,lVar2);
      iVar1 = compareFiles(r1,result);
      if (iVar1 != 0) {
        local_44 = 1;
      }
      xmlFreeDoc(lVar2);
      if (r1 != (char *)0x0) {
        unlink(r1);
        free(r1);
      }
      filename_local._4_4_ = local_44;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
noentParseTest(const char *filename, const char *result,
               const char *err  ATTRIBUTE_UNUSED,
	       int options) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(res);
}